

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O3

bool Diligent::LinuxFileSystem::CreateDirectory(Char *strPath)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  int *piVar5;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> subPath;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  if ((strPath == (Char *)0x0) || (*strPath == '\0')) {
    FormatString<char[31]>(&local_68,(char (*) [31])"Path must not be null or empty");
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"CreateDirectory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Linux/src/LinuxFileSystem.cpp"
               ,0x58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar1 = false;
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    sVar3 = strlen(strPath);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,strPath,strPath + sVar3);
    BasicFileSystem::CorrectSlashes(&local_68,'\0');
    do {
      lVar4 = std::__cxx11::string::find((char)&local_68,0x2f);
      std::__cxx11::string::substr((ulong)local_48,(ulong)&local_68);
      bVar1 = PathExists((Char *)local_48[0]);
      if (!bVar1) {
        iVar2 = mkdir((char *)local_48[0],0x1ff);
        if (iVar2 != 0) {
          piVar5 = __errno_location();
          if (*piVar5 != 0x11) {
            if (local_48[0] != local_38) {
              operator_delete(local_48[0],local_38[0] + 1);
            }
            bVar1 = false;
            goto LAB_0051aae6;
          }
        }
      }
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    } while (lVar4 != -1);
    bVar1 = true;
LAB_0051aae6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool LinuxFileSystem::CreateDirectory(const Char* strPath)
{
    if (strPath == nullptr || strPath[0] == '\0')
    {
        UNEXPECTED("Path must not be null or empty");
        return false;
    }

    std::string path = strPath;
    CorrectSlashes(path);

    size_t position = 0;
    while (position != std::string::npos)
    {
        position     = path.find(SlashSymbol, position + 1);
        auto subPath = path.substr(0, position);
        if (!PathExists(subPath.c_str()))
        {
            if (mkdir(subPath.c_str(), S_IRWXU | S_IRWXG | S_IRWXO) != 0)
            {
                // If multiple threads are trying to create the same directory, it is possible
                // that the directory has been created by another thread, which is OK.
                if (errno != EEXIST)
                    return false;
            }
        }
    }
    return true;
}